

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O2

int OpenMD::findBegin(istream *theStream,char *startText)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char readLine [1024];
  
  std::istream::seekg((long)theStream,_S_beg);
  if (((&theStream->field_0x20)[(long)theStream->_vptr_basic_istream[-3]] & 2) == 0) {
    std::istream::getline((char *)theStream,(long)readLine);
    uVar3 = 1;
    while (((&theStream->field_0x20)[(long)theStream->_vptr_basic_istream[-3]] & 2) == 0) {
      pcVar2 = strtok(readLine," ,;\t");
      if ((((pcVar2 != (char *)0x0) && (iVar1 = strcasecmp("begin",pcVar2), iVar1 == 0)) &&
          (pcVar2 = strtok((char *)0x0," ,;\t"), pcVar2 != (char *)0x0)) &&
         (iVar1 = strcasecmp(startText,pcVar2), iVar1 == 0)) {
        return uVar3;
      }
      if (((&theStream->field_0x20)[(long)theStream->_vptr_basic_istream[-3]] & 2) != 0) break;
      std::istream::getline((char *)theStream,(long)readLine);
      uVar3 = uVar3 + 1;
    }
    printf("Error fast forwarding stream at line %d: stream ended unexpectedly.\n",(ulong)uVar3);
  }
  else {
    puts("Error fast forwarding stream: stream is empty.");
  }
  return -1;
}

Assistant:

int findBegin(std::istream& theStream, const char* startText) {
    const int MAXLEN = 1024;
    char readLine[MAXLEN];
    int foundText = 0;
    int lineNum;
    char* the_token;

    // rewind the stream
    theStream.seekg(0, std::ios::beg);
    lineNum = 0;

    if (!theStream.eof()) {
      theStream.getline(readLine, MAXLEN);
      lineNum++;
    } else {
      printf("Error fast forwarding stream: stream is empty.\n");
      return -1;
    }

    while (!foundText) {
      if (theStream.eof()) {
        printf("Error fast forwarding stream at line %d: "
               "stream ended unexpectedly.\n",
               lineNum);
        return -1;
      }

      the_token = strtok(readLine, " ,;\t");
      if (the_token != NULL)
        if (!strcasecmp("begin", the_token)) {
          the_token = strtok(NULL, " ,;\t");
          if (the_token != NULL) {
            foundText = !strcasecmp(startText, the_token);
          }
        }

      if (!foundText) {
        if (!theStream.eof()) {
          theStream.getline(readLine, MAXLEN);
          lineNum++;
        } else {
          printf("Error fast forwarding stream at line %d: "
                 "stream ended unexpectedly.\n",
                 lineNum);
          return -1;
        }
      }
    }
    return lineNum;
  }